

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall
resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  FileStore *pFVar1;
  allocator<char> local_351;
  string local_350 [32];
  UtcTimeStamp local_330;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  STRING local_2e8;
  StringField local_2c8;
  allocator<char> local_269;
  STRING local_268;
  StringField local_248;
  allocator<char> local_1e9;
  STRING local_1e8;
  StringField local_1c8;
  undefined1 local_170 [8];
  SessionID sessionID;
  resetBeforeAndAfterWithTestFileManager *this_local;
  
  resetBeforeAndAfterFileStoreFixture::resetBeforeAndAfterFileStoreFixture
            (&this->super_resetBeforeAndAfterFileStoreFixture);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"FIX.4.2",&local_1e9);
  FIX::BeginString::BeginString((BeginString *)&local_1c8,&local_1e8);
  beginString = FIX::StringField::operator_cast_to_string_(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"SETGET",&local_269);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_248,&local_268);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"TEST",&local_2e9);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2c8,&local_2e8);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Test",&local_311);
  FIX::SessionID::SessionID((SessionID *)local_170,beginString,senderCompID,targetCompID,&local_310)
  ;
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  FIX::BeginString::~BeginString((BeginString *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pFVar1 = (FileStore *)operator_new(0x138);
  FIX::UtcTimeStamp::now();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"store",&local_351);
  FIX::FileStore::FileStore(pFVar1,&local_330,local_350,local_170);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_330);
  FIX::SessionID::~SessionID((SessionID *)local_170);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager()
      : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy(object);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"), "Test");

    object = new FileStore(UtcTimeStamp::now(), "store", sessionID);
  }